

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver_cluster.hpp
# Opt level: O3

void cluster_points_recalculate(int n,int n_cluster,vec3f *positions,int *clusterids)

{
  vector<int,std::allocator<int>> *this;
  undefined4 uVar1;
  undefined4 uVar2;
  iterator __position;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined1 auVar6 [8];
  uint uVar7;
  int iVar8;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  ostream *poVar12;
  ulong uVar13;
  int *piVar14;
  void *pvVar15;
  long lVar16;
  int *piVar17;
  ulong uVar18;
  float *pfVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [8];
  ofstream fout;
  char local_250 [232];
  ios_base local_168 [264];
  int *local_60;
  long local_58;
  float *local_50;
  int local_44;
  undefined8 local_40;
  int local_38;
  uint local_34;
  undefined1 auVar22 [16];
  
  uStack_270 = 0x158ebe;
  local_260 = (undefined1  [8])local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"receiver cluster","");
  uStack_270 = 0x158ed1;
  github111116::ConsoleLogger::time(&console,(time_t *)local_260);
  local_34 = n;
  if (local_260 != (undefined1  [8])local_250) {
    uStack_270 = 0x158ee5;
    operator_delete((void *)local_260);
  }
  uVar18 = (ulong)(uint)n_cluster;
  lVar10 = uVar18 * 3;
  lVar16 = -(uVar18 * 0xc + 0xf & 0xfffffffffffffff0);
  pvVar15 = (void *)((long)&uStack_268 + lVar16);
  local_60 = clusterids;
  local_38 = n_cluster;
  if (n_cluster == 0) {
    pvVar9 = (void *)((long)pvVar15 - (uVar18 * 0x18 + 0xf & 0xfffffffffffffff0));
    local_40 = local_40 & 0xffffffff00000000;
  }
  else {
    *(undefined8 *)((long)&uStack_270 + lVar16) = 0x158f4b;
    pvVar9 = memset(pvVar15,0,((uVar18 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    uVar7 = local_34;
    local_40 = CONCAT44(local_40._4_4_,(int)CONCAT71((int7)((ulong)pvVar9 >> 8),0 < n_cluster));
    if (n_cluster < 1) {
      pvVar9 = (void *)((long)pvVar15 - (uVar18 * 0x18 + 0xf & 0xfffffffffffffff0));
      local_40 = (ulong)local_40._4_4_ << 0x20;
    }
    else {
      local_50 = (float *)(uVar18 * 0xc);
      lVar20 = 0;
      local_58 = lVar10;
      do {
        *(undefined8 *)((long)&uStack_270 + lVar16) = 0x158f7a;
        iVar8 = rand();
        *(undefined8 *)((long)pvVar15 + lVar20) = *(undefined8 *)(positions + iVar8 % (int)uVar7);
        *(data_t *)(local_260 + lVar20 + lVar16) = positions[iVar8 % (int)uVar7].z;
        lVar20 = lVar20 + 0xc;
      } while (local_50 != (float *)lVar20);
      pvVar9 = (void *)((long)pvVar15 - (local_58 * 8 + 0xfU & 0xfffffffffffffff0));
      lVar10 = local_58;
      if (local_38 == 0) goto LAB_0015902b;
    }
    *(undefined8 *)((long)pvVar9 + -8) = 0x15902b;
    memset(pvVar9,0,((lVar10 * 8 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
LAB_0015902b:
  local_260 = (undefined1  [8])((ulong)local_260 & 0xffffffff00000000);
  local_58 = uVar18 * 8;
  local_50 = (float *)(local_260 + lVar16);
  do {
    while( true ) {
      *(undefined8 *)((long)pvVar9 + -8) = 0x15906a;
      github111116::ConsoleLogger::log<char[27],int>
                (&console,(char (*) [27])"receiver cluster iteration",(int *)local_260);
      if ((char)local_40 != '\0') {
        lVar10 = 0;
        do {
          if (*(long *)((long)pvVar9 + lVar10 + 8) != *(long *)((long)pvVar9 + lVar10)) {
            *(long *)((long)pvVar9 + lVar10 + 8) = *(long *)((long)pvVar9 + lVar10);
          }
          lVar10 = lVar10 + 0x18;
        } while (uVar18 * 0x18 != lVar10);
      }
      local_44 = 0;
      if (0 < (int)local_34) {
        do {
          if ((char)local_40 == '\0') {
            lVar10 = 0;
          }
          else {
            lVar10 = (long)local_44;
            uVar13 = 0;
            fVar24 = 1e+18;
            uVar11 = 0;
            pfVar19 = local_50;
            do {
              fVar25 = positions[lVar10].x - pfVar19[-2];
              fVar26 = positions[lVar10].y - pfVar19[-1];
              fVar27 = positions[lVar10].z - *pfVar19;
              fVar25 = SQRT(fVar27 * fVar27 + fVar25 * fVar25 + fVar26 * fVar26);
              if (fVar25 < fVar24) {
                uVar11 = uVar13 & 0xffffffff;
                fVar24 = fVar25;
              }
              uVar13 = uVar13 + 1;
              pfVar19 = pfVar19 + 3;
            } while (uVar18 != uVar13);
            lVar10 = (long)(int)uVar11;
          }
          this = (vector<int,std::allocator<int>> *)((long)pvVar9 + lVar10 * 0x18);
          __position._M_current = *(int **)(this + 8);
          if (__position._M_current == *(int **)(this + 0x10)) {
            *(undefined8 *)((long)pvVar9 + -8) = 0x159148;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (this,__position,&local_44);
          }
          else {
            *__position._M_current = local_44;
            *(int **)(this + 8) = __position._M_current + 1;
          }
          local_44 = local_44 + 1;
        } while (local_44 < (int)local_34);
      }
      if ((char)local_40 != '\0') break;
      uVar5 = local_260._0_4_;
      local_260._0_4_ = local_260._0_4_ + 1;
      if (8 < (int)uVar5) goto LAB_0015925b;
    }
    uVar11 = 0;
    do {
      piVar3 = *(int **)((long)pvVar9 + uVar11 * 0x18 + 8);
      fVar24 = 0.0;
      fVar25 = 0.0;
      auVar23 = ZEXT816(0);
      uVar13 = 0;
      piVar14 = *(int **)((long)pvVar9 + uVar11 * 0x18);
      for (piVar17 = piVar14; piVar17 != piVar3; piVar17 = piVar17 + 1) {
        auVar23._0_4_ = auVar23._0_4_ + positions[*piVar17].x;
        uVar13 = auVar23._0_8_;
        uVar1 = positions[*piVar17].y;
        uVar2 = positions[*piVar17].z;
        fVar24 = fVar24 + (float)uVar1;
        fVar25 = fVar25 + (float)uVar2;
      }
      fVar26 = (float)(ulong)((long)piVar3 - (long)piVar14 >> 2);
      auVar22._8_4_ = 0;
      auVar22._0_8_ = uVar13;
      auVar22._12_4_ = fVar25;
      auVar21._8_8_ = auVar22._8_8_;
      auVar21._0_4_ = (undefined4)uVar13;
      auVar21._4_4_ = fVar24;
      auVar4._4_4_ = fVar26;
      auVar4._0_4_ = fVar26;
      auVar4._8_8_ = 0;
      auVar23 = divps(auVar21,auVar4);
      *(long *)((long)pvVar15 + uVar11 * 0xc) = auVar23._0_8_;
      *(float *)(local_260 + uVar11 * 0xc + lVar16) = fVar25 / fVar26;
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar18);
    uVar5 = local_260._0_4_;
    local_260._0_4_ = local_260._0_4_ + 1;
  } while ((int)uVar5 < 9);
  if ((char)local_40 != '\0') {
    uVar11 = 0;
    do {
      piVar3 = *(int **)((long)pvVar9 + uVar11 * 0x18 + 8);
      for (piVar14 = *(int **)((long)pvVar9 + uVar11 * 0x18); piVar14 != piVar3;
          piVar14 = piVar14 + 1) {
        local_60[*piVar14] = (int)uVar11;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar18);
  }
LAB_0015925b:
  local_260 = (undefined1  [8])local_250;
  *(undefined8 *)((long)pvVar9 + -8) = 0x15927f;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"receiver cluster","");
  *(undefined8 *)((long)pvVar9 + -8) = 0x159292;
  github111116::ConsoleLogger::timeEnd(&console,(string *)local_260);
  uVar7 = local_34;
  auVar6 = local_260;
  if (local_260 != (undefined1  [8])local_250) {
    *(undefined8 *)((long)pvVar9 + -8) = 0x1592a6;
    operator_delete((void *)auVar6);
  }
  *(undefined8 *)((long)pvVar9 + -8) = 0x1592b9;
  github111116::ConsoleLogger::log<char[27]>(&console,(char (*) [27])"cluster caching to disk...");
  *(undefined8 *)((long)pvVar9 + -8) = 0x1592d1;
  std::ofstream::ofstream(local_260,"cluster.cache",_S_out);
  *(undefined8 *)((long)pvVar9 + -8) = 0x1592df;
  poVar12 = (ostream *)std::ostream::operator<<(local_260,uVar7);
  *(undefined8 *)((long)pvVar9 + -8) = 0x1592f3;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  iVar8 = local_38;
  *(undefined8 *)((long)pvVar9 + -8) = 0x159302;
  poVar12 = (ostream *)std::ostream::operator<<(local_260,iVar8);
  *(undefined8 *)((long)pvVar9 + -8) = 0x159316;
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  if (0 < (int)uVar7) {
    local_50 = (float *)(ulong)uVar7;
    local_40 = (long)local_50 * 0xc;
    uVar18 = 0;
    do {
      fVar24 = *(float *)((long)&positions->x + uVar18);
      *(undefined8 *)((long)pvVar9 + -8) = 0x15934c;
      poVar12 = std::ostream::_M_insert<double>((double)fVar24);
      *(undefined8 *)((long)pvVar9 + -8) = 0x159363;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      fVar24 = *(float *)((long)&positions->y + uVar18);
      *(undefined8 *)((long)pvVar9 + -8) = 0x159375;
      poVar12 = std::ostream::_M_insert<double>((double)fVar24);
      *(undefined8 *)((long)pvVar9 + -8) = 0x15938c;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      fVar24 = *(float *)((long)&positions->z + uVar18);
      *(undefined8 *)((long)pvVar9 + -8) = 0x15939e;
      poVar12 = std::ostream::_M_insert<double>((double)fVar24);
      *(undefined8 *)((long)pvVar9 + -8) = 0x1593b2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      uVar18 = uVar18 + 0xc;
    } while (local_40 != uVar18);
    if (0 < (int)local_34) {
      pfVar19 = (float *)0x0;
      do {
        iVar8 = local_60[(long)pfVar19];
        *(undefined8 *)((long)pvVar9 + -8) = 0x1593e7;
        poVar12 = (ostream *)std::ostream::operator<<(local_260,iVar8);
        *(undefined8 *)((long)pvVar9 + -8) = 0x1593f7;
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        pfVar19 = (float *)((long)pfVar19 + 1);
      } while (local_50 != pfVar19);
    }
  }
  local_260 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_260 + *(long *)(_VTT + -0x18)) = _pthread_mutex_unlock;
  *(undefined8 *)((long)pvVar9 + -8) = 0x15942a;
  std::filebuf::~filebuf((filebuf *)&fout);
  *(undefined8 *)((long)pvVar9 + -8) = 0x159436;
  std::ios_base::~ios_base(local_168);
  if (local_38 != 0) {
    lVar16 = local_58 * 3;
    do {
      pvVar15 = *(void **)((long)pvVar9 + lVar16 + -0x18);
      if (pvVar15 != (void *)0x0) {
        *(undefined8 *)((long)pvVar9 + -8) = 0x159453;
        operator_delete(pvVar15);
      }
      lVar16 = lVar16 + -0x18;
    } while (lVar16 != 0);
  }
  return;
}

Assistant:

void cluster_points_recalculate(int n, int n_cluster, const vec3f* positions, int* clusterids)
{
	console.time("receiver cluster");
	// random initialize clusters
	vec3f center[n_cluster];
	for (int i=0; i<n_cluster; ++i)
		center[i] = positions[rand()%n]; // a few may coincide, doesn't matter

	std::vector<int> assigned[n_cluster];
	for (int k=0; k<10; ++k) {
		console.log("receiver cluster iteration",k);
		for (int i=0; i<n_cluster; ++i)
			assigned[i].clear();
		// assign points to nearest cluster
		for (int i=0; i<n; ++i) {
			float bestnorm = 1e18;
			int best = 0;
			for (int j=0; j<n_cluster; ++j)
				if (bestnorm > norm(positions[i] - center[j])) {
					bestnorm = norm(positions[i] - center[j]);
					best = j;
				}
			assigned[best].push_back(i);
		}
		// move cluster center to average of points
		for (int i=0; i<n_cluster; ++i) {
			vec3f sum = 0;
			for (int x: assigned[i])
				sum += positions[x];
			center[i] = sum / assigned[i].size();
		}
	}
	for (int i=0; i<n_cluster; ++i)
		for (int x: assigned[i])
			clusterids[x] = i;
	console.timeEnd("receiver cluster");
	console.log("cluster caching to disk...");
	std::ofstream fout(cluster_file);
	fout << n << "\n";
	fout << n_cluster << "\n";
	for (int i=0; i<n; ++i)
		fout << positions[i].x << " " << positions[i].y << " " << positions[i].z << "\n";
	for (int i=0; i<n; ++i)
		fout << clusterids[i] << "\n";
}